

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemeditorfactory.cpp
# Opt level: O2

QByteArray * __thiscall
QItemEditorFactory::valuePropertyName
          (QByteArray *__return_storage_ptr__,QItemEditorFactory *this,int userType)

{
  QItemEditorCreatorBase *pQVar1;
  QItemEditorFactory *pQVar2;
  long in_FS_OFFSET;
  QItemEditorCreatorBase *local_28;
  uint local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (QItemEditorCreatorBase *)0x0;
  local_1c = userType;
  pQVar1 = QHash<int,_QItemEditorCreatorBase_*>::value(&this->creatorMap,(int *)&local_1c,&local_28)
  ;
  if (pQVar1 == (QItemEditorCreatorBase *)0x0) {
    pQVar2 = defaultFactory();
    if (pQVar2 == this) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
    else {
      (*pQVar2->_vptr_QItemEditorFactory[3])(__return_storage_ptr__,pQVar2,(ulong)local_1c);
    }
  }
  else {
    (*pQVar1->_vptr_QItemEditorCreatorBase[3])(__return_storage_ptr__,pQVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QItemEditorFactory::valuePropertyName(int userType) const
{
    QItemEditorCreatorBase *creator = creatorMap.value(userType, 0);
    if (!creator) {
        const QItemEditorFactory *dfactory = defaultFactory();
        return dfactory == this ? QByteArray() : dfactory->valuePropertyName(userType);
    }
    return creator->valuePropertyName();
}